

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gf256.cpp
# Opt level: O0

int gf256_init_(int version)

{
  bool bVar1;
  int in_EDI;
  undefined4 local_4;
  
  if (in_EDI == 2) {
    if (Initialized) {
      local_4 = 0;
    }
    else {
      Initialized = true;
      bVar1 = IsExpectedEndian();
      if (bVar1) {
        gf256_architecture_init();
        gf256_poly_init(3);
        gf256_explog_init();
        gf256_muldiv_init();
        gf256_inv_init();
        gf256_sqr_init();
        gf256_mul_mem_init();
        bVar1 = gf256_self_test();
        if (bVar1) {
          local_4 = 0;
        }
        else {
          local_4 = -3;
        }
      }
      else {
        local_4 = -2;
      }
    }
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int gf256_init_(int version)
{
    if (version != GF256_VERSION)
        return -1; // User's header does not match library version.

    // Avoid multiple initialization
    if (Initialized)
        return 0;
    Initialized = true;

    if (!IsExpectedEndian())
        return -2; // Unexpected byte order.

    gf256_architecture_init();
    gf256_poly_init(kDefaultPolynomialIndex);
    gf256_explog_init();
    gf256_muldiv_init();
    gf256_inv_init();
    gf256_sqr_init();
    gf256_mul_mem_init();

    if (!gf256_self_test())
        return -3; // Self-test failed (perhaps untested configuration)

    return 0;
}